

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  secp256k1_ge *r_00;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  secp256k1_ge *psVar47;
  secp256k1_ge *a;
  secp256k1_ge *b;
  secp256k1_ge *a_00;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 uVar58;
  byte bVar59;
  secp256k1_fe tmp;
  undefined1 auStack_1a8 [64];
  byte abStack_168 [32];
  byte abStack_148 [32];
  undefined1 auStack_128 [16];
  uint64_t uStack_118;
  uint64_t uStack_110;
  undefined1 auStack_108 [16];
  uint64_t uStack_f8;
  uint64_t uStack_f0;
  secp256k1_fe *psStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_fe *psStack_c8;
  secp256k1_modinv64_signed62 *psStack_c0;
  code *pcStack_b8;
  code *pcStack_b0;
  long local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  
  bVar59 = 0;
  pcStack_b0 = (code *)0x14cb6a;
  secp256k1_fe_verify(x);
  local_a0 = 0x1000003d1;
  uVar37 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar57 = (uVar37 >> 0x34) + x->n[1];
  uVar40 = (uVar57 >> 0x34) + x->n[2];
  uVar41 = (uVar40 >> 0x34) + x->n[3];
  local_98 = (uVar41 >> 0x34) + (x->n[4] & 0xffffffffffff);
  uVar45 = (uVar37 ^ 0x1000003d0) & uVar57 & uVar40 & uVar41 & (local_98 ^ 0xf000000000000);
  pcStack_b0 = (code *)0x14cc07;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  pcStack_b0 = (code *)0x14cc30;
  secp256k1_fe_normalize(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_90.v[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  pcStack_b0 = (code *)0x14ccc2;
  secp256k1_modinv64(&local_90,&secp256k1_const_modinfo_fe);
  pcStack_b0 = (code *)0x14cccd;
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  pcStack_b0 = (code *)0x14cce9;
  secp256k1_fe_verify(r);
  b = (secp256k1_ge *)(r->n[4] & 0xffffffffffff);
  uVar38 = (r->n[4] >> 0x30) * local_a0 + r->n[0];
  uVar36 = (uVar38 >> 0x34) + r->n[1];
  uVar42 = (uVar36 >> 0x34) + r->n[2];
  uVar46 = (uVar42 >> 0x34) + r->n[3];
  psVar47 = (secp256k1_ge *)((long)(b->x).n + (uVar46 >> 0x34));
  uVar56 = (uVar38 ^ 0x1000003d0) & uVar36 & uVar42 & uVar46 & ((ulong)psVar47 ^ 0xf000000000000);
  uVar37 = (uVar57 | uVar37 | uVar40 | uVar41) & 0xfffffffffffff | local_98;
  if ((uVar45 != 0xfffffffffffff && uVar37 != 0) !=
      (uVar56 == 0xfffffffffffff ||
      ((uVar36 | uVar38 | uVar42 | uVar46) & 0xfffffffffffff) == 0 && psVar47 == (secp256k1_ge *)0x0
      )) {
    secp256k1_fe_verify(r);
    return;
  }
  pcStack_b0 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_1();
  uVar36 = (psVar47->x).n[0];
  if (uVar36 >> 0x3e == 0) {
    uVar38 = (psVar47->x).n[1];
    if (0x3fffffffffffffff < uVar38) goto LAB_0014ce70;
    uVar40 = (psVar47->x).n[2];
    if (0x3fffffffffffffff < uVar40) goto LAB_0014ce75;
    uVar41 = (psVar47->x).n[3];
    if (0x3fffffffffffffff < uVar41) goto LAB_0014ce7a;
    uVar42 = (psVar47->x).n[4];
    if (uVar42 < 0x100) {
      (b->x).n[0] = uVar36 & 0xfffffffffffff;
      (b->x).n[1] = (uVar38 & 0x3ffffffffff) << 10 | uVar36 >> 0x34;
      (b->x).n[2] = (uVar40 & 0xffffffff) << 0x14 | uVar38 >> 0x2a;
      (b->x).n[3] = (ulong)((uint)uVar41 & 0x3fffff) << 0x1e | uVar40 >> 0x20;
      (b->x).n[4] = uVar42 << 0x28 | uVar41 >> 0x16;
      return;
    }
  }
  else {
    pcStack_b8 = (code *)0x14ce70;
    secp256k1_fe_from_signed62_cold_5();
LAB_0014ce70:
    pcStack_b8 = (code *)0x14ce75;
    secp256k1_fe_from_signed62_cold_4();
LAB_0014ce75:
    pcStack_b8 = (code *)0x14ce7a;
    secp256k1_fe_from_signed62_cold_3();
LAB_0014ce7a:
    pcStack_b8 = (code *)0x14ce7f;
    secp256k1_fe_from_signed62_cold_2();
  }
  pcStack_b8 = secp256k1_scalar_split_lambda;
  secp256k1_fe_from_signed62_cold_1();
  a = psVar47;
  a_00 = r_00;
  psStack_e0 = r;
  uStack_d8 = uVar56;
  uStack_d0 = uVar37;
  psStack_c8 = x;
  psStack_c0 = &local_90;
  pcStack_b8 = (code *)uVar45;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if (b == r_00) {
    secp256k1_scalar_split_lambda_cold_6();
LAB_0014d3c1:
    secp256k1_scalar_split_lambda_cold_5();
  }
  else {
    if (psVar47 == r_00) goto LAB_0014d3c1;
    if (b != psVar47) {
      secp256k1_scalar_verify((secp256k1_scalar *)r_00);
      secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g1);
      uVar36 = (r_00->x).n[0];
      uVar37 = (r_00->x).n[1];
      uVar38 = (r_00->x).n[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar36;
      uVar42 = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),8);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar42;
      auStack_1a8._0_8_ = SUB168(auVar1 * ZEXT816(0xe893209a45dbb031),0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar36;
      auVar2 = auVar2 * ZEXT816(0x3daa8a1471e8ca7f);
      uVar41 = SUB168(auVar2 + auVar34,0);
      uVar46 = SUB168(auVar2 + auVar34,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar37;
      uVar45 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
      uVar40 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0);
      auStack_1a8._8_8_ = uVar41 + uVar40;
      uVar40 = (ulong)CARRY8(uVar41,uVar40);
      uVar41 = uVar46 + uVar45;
      uVar56 = uVar41 + uVar40;
      uVar52 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar42,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar46,uVar45) || CARRY8(uVar41,uVar40));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar36;
      uVar57 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),8);
      uVar40 = SUB168(auVar4 * ZEXT816(0xe86c90e49284eb15),0);
      uVar42 = uVar56 + uVar40;
      uVar40 = (ulong)CARRY8(uVar56,uVar40);
      uVar45 = uVar52 + uVar57;
      uVar53 = uVar45 + uVar40;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar37;
      uVar43 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),8);
      uVar41 = SUB168(auVar5 * ZEXT816(0x3daa8a1471e8ca7f),0);
      uVar56 = uVar42 + uVar41;
      uVar41 = (ulong)CARRY8(uVar42,uVar41);
      uVar46 = uVar53 + uVar43;
      uVar54 = uVar46 + uVar41;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar38;
      uVar44 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),8);
      uVar42 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),0);
      auStack_1a8._16_8_ = uVar56 + uVar42;
      uVar42 = (ulong)CARRY8(uVar56,uVar42);
      uVar56 = uVar54 + uVar44;
      uVar55 = uVar56 + uVar42;
      uVar48 = (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar45,uVar40)) +
               (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar46,uVar41)) +
               (ulong)(CARRY8(uVar54,uVar44) || CARRY8(uVar56,uVar42));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar36;
      uVar44 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),8);
      uVar36 = SUB168(auVar7 * ZEXT816(0x3086d221a7d46bcd),0);
      uVar42 = uVar55 + uVar36;
      uVar40 = (ulong)CARRY8(uVar55,uVar36);
      uVar46 = uVar48 + uVar44;
      uVar55 = uVar46 + uVar40;
      uVar36 = (r_00->x).n[3];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar37;
      uVar52 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),8);
      uVar41 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),0);
      uVar45 = uVar42 + uVar41;
      uVar41 = (ulong)CARRY8(uVar42,uVar41);
      uVar56 = uVar55 + uVar52;
      uVar49 = uVar56 + uVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar38;
      uVar53 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),8);
      uVar42 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),0);
      uVar43 = uVar45 + uVar42;
      uVar42 = (ulong)CARRY8(uVar45,uVar42);
      uVar57 = uVar49 + uVar53;
      uVar50 = uVar57 + uVar42;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar36;
      uVar54 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),8);
      uVar45 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),0);
      auStack_1a8._24_8_ = uVar43 + uVar45;
      uVar45 = (ulong)CARRY8(uVar43,uVar45);
      uVar43 = uVar50 + uVar54;
      uVar51 = uVar43 + uVar45;
      uVar44 = (ulong)(CARRY8(uVar48,uVar44) || CARRY8(uVar46,uVar40)) +
               (ulong)(CARRY8(uVar55,uVar52) || CARRY8(uVar56,uVar41)) +
               (ulong)(CARRY8(uVar49,uVar53) || CARRY8(uVar57,uVar42)) +
               (ulong)(CARRY8(uVar50,uVar54) || CARRY8(uVar43,uVar45));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar37;
      uVar56 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),8);
      uVar37 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),0);
      uVar41 = uVar51 + uVar37;
      uVar37 = (ulong)CARRY8(uVar51,uVar37);
      uVar42 = uVar44 + uVar56;
      uVar52 = uVar42 + uVar37;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar38;
      uVar57 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),8);
      uVar40 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),0);
      uVar46 = uVar41 + uVar40;
      uVar40 = (ulong)CARRY8(uVar41,uVar40);
      uVar45 = uVar52 + uVar57;
      uVar53 = uVar45 + uVar40;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar36;
      uVar43 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),8);
      uVar41 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),0);
      auStack_1a8._32_8_ = uVar46 + uVar41;
      uVar41 = (ulong)CARRY8(uVar46,uVar41);
      uVar46 = uVar53 + uVar43;
      uVar54 = uVar46 + uVar41;
      uVar46 = (ulong)(CARRY8(uVar44,uVar56) || CARRY8(uVar42,uVar37)) +
               (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar45,uVar40)) +
               (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar46,uVar41));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar38;
      uVar42 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),8);
      uVar37 = SUB168(auVar14 * ZEXT816(0x3086d221a7d46bcd),0);
      uVar41 = uVar54 + uVar37;
      uVar37 = (ulong)CARRY8(uVar54,uVar37);
      uVar40 = uVar46 + uVar42;
      uVar56 = uVar40 + uVar37;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar36;
      uVar45 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),8);
      uVar38 = SUB168(auVar15 * ZEXT816(0xe86c90e49284eb15),0);
      auStack_1a8._40_8_ = uVar41 + uVar38;
      uVar38 = (ulong)CARRY8(uVar41,uVar38);
      uVar41 = uVar56 + uVar45;
      auStack_1a8._56_8_ =
           (ulong)(CARRY8(uVar46,uVar42) || CARRY8(uVar40,uVar37)) +
           (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar41,uVar38));
      auStack_1a8._48_8_ = uVar41 + uVar38;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar36;
      auStack_1a8._48_16_ = auVar16 * ZEXT816(0x3086d221a7d46bcd) + auStack_1a8._48_16_;
      uStack_118 = 0;
      uStack_110 = 0;
      auStack_128 = auStack_1a8._48_16_;
      secp256k1_scalar_cadd_bit
                ((secp256k1_scalar *)auStack_128,0,(uint)((ulong)auStack_1a8._40_8_ >> 0x3f));
      secp256k1_scalar_verify((secp256k1_scalar *)auStack_128);
      secp256k1_scalar_verify((secp256k1_scalar *)r_00);
      secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g2);
      uVar36 = (r_00->x).n[0];
      uVar37 = (r_00->x).n[1];
      uVar38 = (r_00->x).n[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar36;
      uVar42 = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),8);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar42;
      auStack_1a8._0_8_ = SUB168(auVar17 * ZEXT816(0x1571b4ae8ac47f71),0);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar36;
      auVar18 = auVar18 * ZEXT816(0x221208ac9df506c6);
      uVar41 = SUB168(auVar18 + auVar35,0);
      uVar46 = SUB168(auVar18 + auVar35,8);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar37;
      uVar45 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
      uVar40 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
      auStack_1a8._8_8_ = uVar41 + uVar40;
      uVar40 = (ulong)CARRY8(uVar41,uVar40);
      uVar41 = uVar46 + uVar45;
      uVar56 = uVar41 + uVar40;
      uVar52 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar42,auVar18._0_8_)) +
               (ulong)(CARRY8(uVar46,uVar45) || CARRY8(uVar41,uVar40));
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar36;
      uVar57 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),8);
      uVar40 = SUB168(auVar20 * ZEXT816(0x6f547fa90abfe4c4),0);
      uVar42 = uVar56 + uVar40;
      uVar40 = (ulong)CARRY8(uVar56,uVar40);
      uVar45 = uVar52 + uVar57;
      uVar53 = uVar45 + uVar40;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar37;
      uVar43 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),8);
      uVar41 = SUB168(auVar21 * ZEXT816(0x221208ac9df506c6),0);
      uVar56 = uVar42 + uVar41;
      uVar41 = (ulong)CARRY8(uVar42,uVar41);
      uVar46 = uVar53 + uVar43;
      uVar54 = uVar46 + uVar41;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar38;
      uVar44 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),8);
      uVar42 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),0);
      auStack_1a8._16_8_ = uVar56 + uVar42;
      uVar42 = (ulong)CARRY8(uVar56,uVar42);
      uVar56 = uVar54 + uVar44;
      uVar55 = uVar56 + uVar42;
      uVar48 = (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar45,uVar40)) +
               (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar46,uVar41)) +
               (ulong)(CARRY8(uVar54,uVar44) || CARRY8(uVar56,uVar42));
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar36;
      uVar44 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),8);
      uVar36 = SUB168(auVar23 * ZEXT816(0xe4437ed6010e8828),0);
      uVar42 = uVar55 + uVar36;
      uVar40 = (ulong)CARRY8(uVar55,uVar36);
      uVar46 = uVar48 + uVar44;
      uVar55 = uVar46 + uVar40;
      uVar36 = (r_00->x).n[3];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar37;
      uVar52 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),8);
      uVar41 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),0);
      uVar45 = uVar42 + uVar41;
      uVar41 = (ulong)CARRY8(uVar42,uVar41);
      uVar56 = uVar55 + uVar52;
      uVar49 = uVar56 + uVar41;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar38;
      uVar53 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),8);
      uVar42 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),0);
      uVar43 = uVar45 + uVar42;
      uVar42 = (ulong)CARRY8(uVar45,uVar42);
      uVar57 = uVar49 + uVar53;
      uVar50 = uVar57 + uVar42;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar36;
      uVar54 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),8);
      uVar45 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),0);
      auStack_1a8._24_8_ = uVar43 + uVar45;
      uVar45 = (ulong)CARRY8(uVar43,uVar45);
      uVar43 = uVar50 + uVar54;
      uVar51 = uVar43 + uVar45;
      uVar44 = (ulong)(CARRY8(uVar48,uVar44) || CARRY8(uVar46,uVar40)) +
               (ulong)(CARRY8(uVar55,uVar52) || CARRY8(uVar56,uVar41)) +
               (ulong)(CARRY8(uVar49,uVar53) || CARRY8(uVar57,uVar42)) +
               (ulong)(CARRY8(uVar50,uVar54) || CARRY8(uVar43,uVar45));
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar37;
      uVar56 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),8);
      uVar37 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),0);
      uVar41 = uVar51 + uVar37;
      uVar37 = (ulong)CARRY8(uVar51,uVar37);
      uVar42 = uVar44 + uVar56;
      uVar52 = uVar42 + uVar37;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar38;
      uVar57 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),8);
      uVar40 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),0);
      uVar46 = uVar41 + uVar40;
      uVar40 = (ulong)CARRY8(uVar41,uVar40);
      uVar45 = uVar52 + uVar57;
      uVar53 = uVar45 + uVar40;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar36;
      uVar43 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),8);
      uVar41 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),0);
      auStack_1a8._32_8_ = uVar46 + uVar41;
      uVar41 = (ulong)CARRY8(uVar46,uVar41);
      uVar46 = uVar53 + uVar43;
      uVar54 = uVar46 + uVar41;
      uVar46 = (ulong)(CARRY8(uVar44,uVar56) || CARRY8(uVar42,uVar37)) +
               (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar45,uVar40)) +
               (ulong)(CARRY8(uVar53,uVar43) || CARRY8(uVar46,uVar41));
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar38;
      uVar42 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),8);
      uVar37 = SUB168(auVar30 * ZEXT816(0xe4437ed6010e8828),0);
      uVar41 = uVar54 + uVar37;
      uVar37 = (ulong)CARRY8(uVar54,uVar37);
      uVar40 = uVar46 + uVar42;
      uVar56 = uVar40 + uVar37;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar36;
      uVar45 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),8);
      uVar38 = SUB168(auVar31 * ZEXT816(0x6f547fa90abfe4c4),0);
      auStack_1a8._40_8_ = uVar41 + uVar38;
      uVar38 = (ulong)CARRY8(uVar41,uVar38);
      uVar41 = uVar56 + uVar45;
      auVar33._8_8_ =
           (ulong)(CARRY8(uVar46,uVar42) || CARRY8(uVar40,uVar37)) +
           (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar41,uVar38));
      auVar33._0_8_ = uVar41 + uVar38;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar36;
      auStack_1a8._48_16_ = auVar32 * ZEXT816(0xe4437ed6010e8828) + auVar33;
      uStack_f8 = 0;
      uStack_f0 = 0;
      auStack_108 = auStack_1a8._48_16_;
      secp256k1_scalar_cadd_bit
                ((secp256k1_scalar *)auStack_108,0,(uint)((ulong)auStack_1a8._40_8_ >> 0x3f));
      secp256k1_scalar_verify((secp256k1_scalar *)auStack_108);
      secp256k1_scalar_mul
                ((secp256k1_scalar *)auStack_128,(secp256k1_scalar *)auStack_128,
                 &secp256k1_scalar_split_lambda::minus_b1);
      secp256k1_scalar_mul
                ((secp256k1_scalar *)auStack_108,(secp256k1_scalar *)auStack_108,
                 &secp256k1_scalar_split_lambda::minus_b2);
      secp256k1_scalar_add
                ((secp256k1_scalar *)psVar47,(secp256k1_scalar *)auStack_128,
                 (secp256k1_scalar *)auStack_108);
      secp256k1_scalar_mul
                ((secp256k1_scalar *)b,(secp256k1_scalar *)psVar47,&secp256k1_const_lambda);
      secp256k1_scalar_negate((secp256k1_scalar *)b,(secp256k1_scalar *)b);
      secp256k1_scalar_add((secp256k1_scalar *)b,(secp256k1_scalar *)b,(secp256k1_scalar *)r_00);
      secp256k1_scalar_verify((secp256k1_scalar *)b);
      secp256k1_scalar_verify((secp256k1_scalar *)psVar47);
      secp256k1_scalar_mul
                ((secp256k1_scalar *)auStack_1a8,&secp256k1_const_lambda,(secp256k1_scalar *)psVar47
                );
      a = (secp256k1_ge *)auStack_1a8;
      secp256k1_scalar_add
                ((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)auStack_1a8,
                 (secp256k1_scalar *)b);
      secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a8);
      a_00 = r_00;
      secp256k1_scalar_verify((secp256k1_scalar *)r_00);
      if ((((auStack_1a8._0_8_ == (r_00->x).n[0]) && (auStack_1a8._8_8_ == (r_00->x).n[1])) &&
          (auStack_1a8._16_8_ == (r_00->x).n[2])) && (auStack_1a8._24_8_ == (r_00->x).n[3])) {
        secp256k1_scalar_negate((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)b);
        secp256k1_scalar_get_b32(abStack_148,(secp256k1_scalar *)b);
        secp256k1_scalar_get_b32(abStack_168,(secp256k1_scalar *)auStack_1a8);
        lVar39 = 0;
        do {
          if (abStack_148[lVar39] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar39]) {
            if (abStack_148[lVar39] < (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar39]
               ) goto LAB_0014d346;
            break;
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != 0x20);
        uVar36 = 0;
        do {
          uVar58 = abStack_168[uVar36] <
                   (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar36];
          if (abStack_168[uVar36] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar36])
          goto LAB_0014d344;
          uVar36 = uVar36 + 1;
          uVar58 = uVar36 < 0x20;
        } while (uVar36 != 0x20);
        do {
          secp256k1_scalar_split_lambda_cold_2();
LAB_0014d344:
        } while (!(bool)uVar58);
LAB_0014d346:
        secp256k1_scalar_negate((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)psVar47);
        secp256k1_scalar_get_b32(abStack_148,(secp256k1_scalar *)psVar47);
        secp256k1_scalar_get_b32(abStack_168,(secp256k1_scalar *)auStack_1a8);
        lVar39 = 0;
        do {
          if (abStack_148[lVar39] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar39]) {
            if (abStack_148[lVar39] < (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar39]
               ) {
              return;
            }
            break;
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != 0x20);
        uVar36 = 0;
        do {
          uVar58 = abStack_168[uVar36] <
                   (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar36];
          if (abStack_168[uVar36] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar36])
          goto LAB_0014d3a8;
          uVar36 = uVar36 + 1;
          uVar58 = uVar36 < 0x20;
        } while (uVar36 != 0x20);
        do {
          secp256k1_scalar_split_lambda_cold_1();
LAB_0014d3a8:
        } while (!(bool)uVar58);
        return;
      }
      goto LAB_0014d3cb;
    }
  }
  secp256k1_scalar_split_lambda_cold_4();
LAB_0014d3cb:
  secp256k1_scalar_split_lambda_cold_3();
  secp256k1_ge_verify(a);
  psVar47 = a_00;
  for (lVar39 = 0xd; lVar39 != 0; lVar39 = lVar39 + -1) {
    (psVar47->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((long)a + (ulong)bVar59 * -0x10 + 8);
    psVar47 = (secp256k1_ge *)((long)psVar47 + (ulong)bVar59 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_00->x,&a_00->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}